

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O0

void __thiscall QSystemTrayIconPrivate::~QSystemTrayIconPrivate(QSystemTrayIconPrivate *this)

{
  QSystemTrayIconPrivate *in_RDI;
  
  ~QSystemTrayIconPrivate(in_RDI);
  operator_delete(in_RDI,200);
  return;
}

Assistant:

QSystemTrayIconPrivate::~QSystemTrayIconPrivate()
{
    delete qpa_sys;
}